

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O2

int __thiscall
qclab::qgates::RotationY<std::complex<float>_>::toQASM
          (RotationY<std::complex<float>_> *this,ostream *stream,int offset)

{
  int iVar1;
  float angle;
  __string_type _Stack_38;
  
  iVar1 = (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
          qubit_;
  angle = QRotation<float>::theta(&(this->super_QRotationGate1<std::complex<float>_>).rotation_);
  qasmRy<float>(&_Stack_38,offset + iVar1,angle);
  std::operator<<(stream,(string *)&_Stack_38);
  std::__cxx11::string::~string((string *)&_Stack_38);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRy( this->qubit_ + offset , this->theta() ) ;
          return 0 ;
        }